

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  pointer puVar1;
  _Alloc_hider msgHash;
  bool bVar2;
  ostream *poVar3;
  ptrdiff_t _Num;
  ulong __n;
  string x;
  Secp256K1 p;
  string key;
  string local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  string local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  Secp256K1 local_88;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"f7c32876271e88dbb576d575170de7162aed93a398deec0f7fdb330bc3f49956",
             "");
  Secp256K1::Secp256K1(&local_88,&local_50);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Private key: ",0xd);
  Secp256K1::privateKeyHex_abi_cxx11_(&local_f8,&local_88);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Public key: ",0xc);
  Secp256K1::publicKeyHex_abi_cxx11_(&local_f8,&local_88);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_f8._M_dataplus._M_p,local_f8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,
             "de7761f8874d23d4e8f3f26f321ade560556c23c8d7c7c8227bfefaa83f2c485b511d12037bd1e1f9730f5cc031784e895d263f557793215c2f401f3cc5cfe2f"
             ,"");
  Secp256K1::base16Decode(&local_f8,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  Secp256K1::Sign((tuple<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> *)
                  &local_c0,&local_88,(uint8_t *)local_f8._M_dataplus._M_p);
  if ((char)local_c0._M_dataplus._M_p == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nsignature success",0x12);
    msgHash._M_p = local_f8._M_dataplus._M_p;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = local_c0.field_2._M_allocated_capacity - local_c0._M_string_length;
    if (__n == 0) {
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      if ((long)__n < 0) {
        std::__throw_bad_alloc();
      }
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(__n);
    }
    puVar1 = local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + __n;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar1;
    if (local_c0.field_2._M_allocated_capacity != local_c0._M_string_length) {
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      memmove(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start,(void *)local_c0._M_string_length,__n);
    }
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
    Secp256K1::publicKey(&local_a0,&local_88);
    bVar2 = Secp256K1::Verify((uint8_t *)msgHash._M_p,&local_d8,&local_a0);
    if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nVerified!!!\n",0xd);
    }
  }
  if ((void *)local_c0._M_string_length != (void *)0x0) {
    operator_delete((void *)local_c0._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  Secp256K1::~Secp256K1(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main()
{
    std::string key = "f7c32876271e88dbb576d575170de7162aed93a398deec0f7fdb330bc3f49956";
    Secp256K1 p { key };
    std::cout << "Private key: " << p.privateKeyHex() << std::endl;
    std::cout << "Public key: " << p.publicKeyHex() << std::endl;

    std::string x = Secp256K1::base16Decode("de7761f8874d23d4e8f3f26f321ade560556c23c8d7c7c8227bfefaa83f2c485b511d12037bd1e1f9730f5cc031784e895d263f557793215c2f401f3cc5cfe2f");
    std::vector<uint8_t> res;

    bool suc;
    std::tie(res, suc) = p.Sign((const unsigned char*)x.c_str());
    if (suc) {
        std::cout << "\nsignature success";

        bool verified = Secp256K1::Verify((const uint8_t*)x.c_str(), res, p.publicKey());
        //        bool verified = p.Verify((const uint8_t*)x.c_str(), res);
        if (verified) {
            std::cout << "\nVerified!!!\n";
        }
    }
    return 0;
}